

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_threaded.cpp
# Opt level: O1

CTextureHandle __thiscall
CGraphics_Threaded::LoadTexture
          (CGraphics_Threaded *this,char *pFilename,int StorageType,int StoreFormat,int Flags)

{
  int iVar1;
  int iVar2;
  long in_FS_OFFSET;
  CImageInfo Img;
  undefined4 local_50;
  undefined4 local_4c;
  int local_48;
  void *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = str_length(pFilename);
  iVar2 = -1;
  if (2 < iVar1) {
    iVar2 = (**(code **)(*(long *)this + 0x70))(this,&local_50,pFilename,StorageType);
    if (iVar2 == 0) {
      iVar2 = (this->m_InvalidTexture).m_Id;
    }
    else {
      if (StoreFormat == -1) {
        StoreFormat = local_48;
      }
      iVar2 = (**(code **)(*(long *)this + 0x80))
                        (this,local_50,local_4c,local_48,local_40,StoreFormat,Flags);
      mem_free(local_40);
      if ((iVar2 != (this->m_InvalidTexture).m_Id) && (this->m_pConfig->m_Debug != 0)) {
        dbg_msg("graphics/texture","loaded %s",pFilename);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (CTextureHandle)iVar2;
  }
  __stack_chk_fail();
}

Assistant:

IGraphics::CTextureHandle CGraphics_Threaded::LoadTexture(const char *pFilename, int StorageType, int StoreFormat, int Flags)
{
	int l = str_length(pFilename);
	IGraphics::CTextureHandle ID;
	CImageInfo Img;

	if(l < 3)
		return CTextureHandle();
	if(LoadPNG(&Img, pFilename, StorageType))
	{
		if (StoreFormat == CImageInfo::FORMAT_AUTO)
			StoreFormat = Img.m_Format;

		ID = LoadTextureRaw(Img.m_Width, Img.m_Height, Img.m_Format, Img.m_pData, StoreFormat, Flags);
		mem_free(Img.m_pData);
		if(ID.Id() != m_InvalidTexture.Id() && m_pConfig->m_Debug)
			dbg_msg("graphics/texture", "loaded %s", pFilename);
		return ID;
	}

	return m_InvalidTexture;
}